

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void find_rectangles(Mat *image,
                    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *rectangles)

{
  char cVar1;
  uint uVar2;
  int j;
  long lVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong in_XMM4_Qb;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> approx;
  _InputArray local_3d8;
  _InputArray local_3c0;
  int local_3a4;
  int ch [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  undefined8 local_350;
  undefined8 local_348;
  _InputArray local_340;
  double local_328;
  ulong uStack_320;
  undefined8 local_318;
  undefined1 local_310 [16];
  uchar *local_300;
  Mat gray0;
  Mat blurred;
  undefined1 local_1f0 [16];
  uchar *local_1e0;
  Mat gray;
  
  cv::Mat::Mat(&blurred,image);
  local_1e0 = (uchar *)0x0;
  gray0.data = (uchar *)0x0;
  local_1f0._0_4_ = 0x1010000;
  gray0.flags = 0x2010000;
  gray0._8_8_ = &blurred;
  local_1f0._8_8_ = image;
  cv::medianBlur((_InputArray *)local_1f0,(_OutputArray *)&gray0,9);
  local_318 = CONCAT44((int)*(undefined8 *)blurred.size.p,
                       (int)((ulong)*(undefined8 *)blurred.size.p >> 0x20));
  iVar4 = 0;
  cv::Mat::Mat(&gray0,&local_318,0);
  cv::Mat::Mat(&gray);
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_00103615:
  if (iVar4 == 3) {
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(&contours);
    cv::Mat::~Mat(&gray);
    cv::Mat::~Mat(&gray0);
    cv::Mat::~Mat(&blurred);
    return;
  }
  ch[1] = 0;
  ch[0] = iVar4;
  cv::mixChannels(&blurred,1,&gray0,1,ch,1);
  local_3a4 = 0;
  do {
    if (local_3a4 == 0) {
      local_1e0 = (uchar *)0x0;
      local_300 = (uchar *)0x0;
      local_1f0._0_4_ = 0x1010000;
      local_1f0._8_8_ = &gray0;
      local_310._0_4_ = 0x2010000;
      local_310._8_8_ = &gray;
      cv::Canny((_InputArray *)local_1f0,(_OutputArray *)local_310,10.0,20.0,3,false);
      approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c0.sz.width = 0;
      local_3c0.sz.height = 0;
      approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x1010000;
      approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&gray;
      local_3c0.flags = 0x2010000;
      local_3c0.obj = &gray;
      cv::Mat::Mat((Mat *)local_1f0);
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_348 = 0xffffffffffffffff;
      local_3d8.obj = (Mat *)local_1f0;
      cv::Scalar_<double>::all((Scalar_<double> *)local_310,1.79769313486232e+308);
      cv::dilate(&approx,&local_3c0,&local_3d8,&local_348,1,0,(Mat *)local_310);
      cv::Mat::~Mat((Mat *)local_1f0);
    }
    else {
      if (local_3a4 == 2) break;
      cv::operator>=((Mat *)local_1f0,255.0);
      (**(code **)(*(long *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_) + 0x18))
                ((long *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_),(Mat *)local_1f0,&gray,
                 0xffffffffffffffff);
      cv::MatExpr::~MatExpr((MatExpr *)local_1f0);
    }
    local_1e0 = (uchar *)0x0;
    local_1f0._0_4_ = 0x1010000;
    local_300 = (uchar *)0x0;
    local_310._0_4_ = -0x7dfbfff4;
    local_310._8_8_ = &contours;
    local_350 = 0;
    local_1f0._8_8_ = &gray;
    cv::findContours((Mat *)local_1f0,(Mat *)local_310,1,2,&local_350);
    approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = 0;
    while( true ) {
      if ((ulong)(((long)contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)contours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar5) break;
      cv::Mat::Mat<cv::Point_<int>>
                ((Mat *)local_1f0,
                 contours.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,false);
      local_3c0.sz.width = 0;
      local_3c0.sz.height = 0;
      local_3c0.flags = 0x1010000;
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = -0x7dfcfff4;
      local_3d8.obj = &approx;
      local_3c0.obj = (Mat *)local_1f0;
      cv::Mat::Mat<cv::Point_<int>>
                ((Mat *)local_310,
                 contours.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,false);
      local_340.sz.width = 0;
      local_340.sz.height = 0;
      local_340.flags = 0x1010000;
      local_340.obj = (Mat *)local_310;
      dVar6 = (double)cv::arcLength(&local_340,true);
      cv::approxPolyDP(&local_3c0,(_OutputArray *)&local_3d8,dVar6 * 0.02,true);
      cv::Mat::~Mat((Mat *)local_310);
      cv::Mat::~Mat((Mat *)local_1f0);
      if ((long)approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x20) {
        cv::Mat::Mat<cv::Point_<int>>((Mat *)local_1f0,&approx,false);
        local_3c0.sz.width = 0;
        local_3c0.sz.height = 0;
        local_3c0.flags = 0x1010000;
        local_3c0.obj = (Mat *)local_1f0;
        dVar6 = (double)cv::contourArea(&local_3c0,false);
        if (ABS(dVar6) <= 1000.0) {
          cv::Mat::~Mat((Mat *)local_1f0);
        }
        else {
          cv::Mat::Mat<cv::Point_<int>>((Mat *)local_310,&approx,false);
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x1010000;
          local_3d8.obj = (Mat *)local_310;
          cVar1 = cv::isContourConvex(&local_3d8);
          cv::Mat::~Mat((Mat *)local_310);
          cv::Mat::~Mat((Mat *)local_1f0);
          if (cVar1 != '\0') {
            dVar6 = 0.0;
            for (lVar3 = 2; lVar3 != 5; lVar3 = lVar3 + 1) {
              uVar2 = (uint)lVar3 & 3;
              dVar8 = (double)(approx.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar2].x -
                              approx.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].x);
              dVar9 = (double)(approx.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar2].y -
                              approx.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].y);
              dVar10 = (double)(approx.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar3 + -2].x -
                               approx.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].x);
              dVar11 = (double)(approx.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar3 + -2].y -
                               approx.
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].y);
              dVar7 = (dVar10 * dVar10 + dVar11 * dVar11) * (dVar8 * dVar8 + dVar9 * dVar9) + 1e-10;
              if (dVar7 < 0.0) {
                local_328 = dVar8;
                uStack_320 = in_XMM4_Qb;
                dVar7 = sqrt(dVar7);
                dVar8 = local_328;
                in_XMM4_Qb = uStack_320;
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              dVar8 = ABS((dVar8 * dVar10 + dVar9 * dVar11) / dVar7);
              in_XMM4_Qb = in_XMM4_Qb & 0x7fffffffffffffff;
              if (dVar8 <= dVar6) {
                dVar8 = dVar6;
              }
              dVar6 = dVar8;
            }
            if (dVar6 < 0.3) {
              std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::push_back(rectangles,&approx);
            }
          }
        }
      }
      uVar5 = uVar5 + 1;
    }
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
              (&approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
    local_3a4 = local_3a4 + 1;
  } while( true );
  iVar4 = iVar4 + 1;
  local_3a4 = 2;
  goto LAB_00103615;
}

Assistant:

void find_rectangles(Mat& image, vector<vector<Point> >& rectangles)
{
    // blur will enhance edge detection
    Mat blurred(image);
    medianBlur(image, blurred, 9);

    Mat gray0(blurred.size(), CV_8U), gray;
    vector<vector<Point>> contours;

    // find rectangles in every color plane of the image
    for (int c = 0; c < 3; c++)
    {
        int ch[] = {c, 0};
        mixChannels(&blurred, 1, &gray0, 1, ch, 1);

        // try several threshold levels
        const int threshold_level = 2;
        for (int l = 0; l < threshold_level; l++)
        {
            // Use Canny instead of zero threshold level!
            // Canny helps to catch rectangles with gradient shading
            if (l == 0)
            {
                Canny(gray0, gray, 10, 20, 3); //
                // Dilate helps to remove potential holes between edge segments
                dilate(gray, gray, Mat(), Point(-1,-1));
            }
            else
            {
                    gray = gray0 >= (l+1) * 255 / threshold_level;
            }

            // Find contours and store them in a list
            findContours(gray, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

            // Test contours
            vector<Point> approx;
            for (size_t i = 0; i < contours.size(); i++)
            {
                    // approximate contour with accuracy proportional
                    // to the contour perimeter
                    approxPolyDP(Mat(contours[i]), approx, arcLength(Mat(contours[i]), true)*0.02, true);

                    // Note: absolute value of an area is used because
                    // area may be positive or negative - in accordance with the
                    // contour orientation
                    if (approx.size() == 4 &&
                            fabs(contourArea(Mat(approx))) > 1000 &&
                            isContourConvex(Mat(approx)))
                    {
                            double maxCosine = 0;

                            for (int j = 2; j < 5; j++)
                            {
                                    double cosine = fabs(angle(approx[j%4], approx[j-2], approx[j-1]));
                                    maxCosine = MAX(maxCosine, cosine);
                            }

                            if (maxCosine < 0.3)
                              rectangles.push_back(approx);
                    }
            }
        }
    }
}